

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPath.cpp
# Opt level: O2

void __thiscall CppUnit::TestPath::insert(TestPath *this,Test *test,int index)

{
  int iVar1;
  out_of_range *this_00;
  const_iterator local_a8;
  _Self local_88;
  _Self local_68;
  iterator local_48;
  Test *local_28;
  Test *test_local;
  
  local_28 = test;
  if (-1 < index) {
    iVar1 = (*this->_vptr_TestPath[10])();
    if (index <= iVar1) {
      local_68._M_cur =
           (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
      local_68._M_first =
           (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>.
           _M_impl.super__Deque_impl_data._M_start._M_first;
      local_68._M_last =
           (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>.
           _M_impl.super__Deque_impl_data._M_start._M_last;
      local_68._M_node =
           (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>.
           _M_impl.super__Deque_impl_data._M_start._M_node;
      std::operator+(&local_88,&local_68,(ulong)(uint)index);
      local_a8._M_cur = local_88._M_cur;
      local_a8._M_first = local_88._M_first;
      local_a8._M_last = local_88._M_last;
      local_a8._M_node = local_88._M_node;
      std::deque<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>::insert
                (&local_48,&this->m_tests,&local_a8,&local_28);
      return;
    }
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"TestPath::insert(): index out of range");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void 
TestPath::insert( Test *test, 
                  int index )
{
  if ( index < 0  ||  index > getTestCount() )
    throw std::out_of_range( "TestPath::insert(): index out of range" );
  m_tests.insert( m_tests.begin() + index, test );
}